

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

Option * __thiscall CLI::App::get_option(App *this,string *option_name)

{
  Option *pOVar1;
  OptionNotFound *this_00;
  string local_60;
  string local_40;
  
  ::std::__cxx11::string::string((string *)&local_40,(string *)option_name);
  pOVar1 = get_option_no_throw(this,&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  if (pOVar1 != (Option *)0x0) {
    return pOVar1;
  }
  this_00 = (OptionNotFound *)__cxa_allocate_exception(0x38);
  ::std::__cxx11::string::string((string *)&local_60,(string *)option_name);
  OptionNotFound::OptionNotFound(this_00,&local_60);
  __cxa_throw(this_00,&OptionNotFound::typeinfo,Error::~Error);
}

Assistant:

CLI11_NODISCARD const Option *get_option(std::string option_name) const {
        const auto *opt = get_option_no_throw(option_name);
        if(opt == nullptr) {
            throw OptionNotFound(option_name);
        }
        return opt;
    }